

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::on_disk_read_complete
          (peer_connection *this,disk_buffer_holder *buffer,storage_error *error,peer_request *r,
          time_point issue_time)

{
  peer_request *ppVar1;
  peer_request *args;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int64_t iVar6;
  char *pcVar7;
  undefined8 uVar8;
  alert_manager *paVar9;
  element_type *peVar10;
  disk_buffer_holder local_f8;
  int local_e0;
  undefined1 local_d9;
  int local_d8;
  undefined1 local_d1;
  undefined1 local_d0 [24];
  string local_b8;
  uint local_98;
  undefined4 local_94;
  undefined1 local_8d;
  undefined1 local_80 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  rep local_48;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_3c;
  peer_request *ppStack_38;
  int disk_rtt;
  peer_request *r_local;
  storage_error *error_local;
  disk_buffer_holder *buffer_local;
  peer_connection *this_local;
  time_point issue_time_local;
  
  ppStack_38 = r;
  r_local = (peer_request *)error;
  error_local = (storage_error *)buffer;
  buffer_local = (disk_buffer_holder *)this;
  this_local = (peer_connection *)issue_time.__d.__r;
  local_50.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  local_48 = (rep)::std::chrono::operator-
                            (&local_50,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&this_local);
  iVar6 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)local_48);
  local_3c.m_val = (uint)iVar6;
  bVar2 = should_log(this,info);
  if (bVar2) {
    uVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)ppStack_38);
    uVar4 = ppStack_38->start;
    iVar5 = ppStack_38->length;
    pcVar7 = disk_buffer_holder::data(buffer);
    boost::system::error_code::message_abi_cxx11_
              ((string *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(error_code *)r_local);
    uVar8 = ::std::__cxx11::string::c_str();
    peer_log(this,info,"FILE_ASYNC_READ_COMPLETE","piece: %d s: %x l: %x b: %p e: %s rtt: %d us",
             (ulong)uVar3,(ulong)uVar4,iVar5,pcVar7,uVar8,local_3c.m_val);
    ::std::__cxx11::string::~string
              ((string *)
               &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  this->m_reading_bytes = this->m_reading_bytes - ppStack_38->length;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_80);
  bVar2 = storage_error::operator_cast_to_bool((storage_error *)r_local);
  if (bVar2) {
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
    if (bVar2) {
      local_98 = (ppStack_38->piece).m_val;
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x26])(this,(ulong)local_98);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,ppStack_38);
      peVar10 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_80);
      paVar9 = torrent::alerts(peVar10);
      bVar2 = alert_manager::should_post<libtorrent::file_error_alert>(paVar9);
      if (bVar2) {
        peVar10 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_80);
        paVar9 = torrent::alerts(peVar10);
        args = r_local;
        peVar10 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_80);
        local_d0._20_4_ = storage_error::file((storage_error *)r_local);
        torrent::resolve_filename_abi_cxx11_
                  ((string *)(local_d0 + 0x18),peVar10,(file_index_t)local_d0._20_4_);
        ppVar1 = r_local + 1;
        ::std::
        __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_80);
        torrent::get_handle((torrent *)local_d0);
        alert_manager::
        emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                  (paVar9,(error_code *)args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_d0 + 0x18),(operation_t *)((long)&ppVar1->start + 3),
                   (torrent_handle *)local_d0);
        torrent_handle::~torrent_handle((torrent_handle *)local_d0);
        ::std::__cxx11::string::~string((string *)(local_d0 + 0x18));
      }
      this->m_disk_read_failures = this->m_disk_read_failures + '\x01';
      if (100 < this->m_disk_read_failures) {
        local_d1 = 0;
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,r_local,8,0);
      }
      local_94 = 1;
    }
    else {
      local_8d = 0;
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,r_local,8,0);
      local_94 = 1;
    }
  }
  else {
    this->m_disk_read_failures = '\0';
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
    if ((bVar2) &&
       (iVar5 = session_settings::get_int
                          ((this->super_peer_connection_hot_members).m_settings,0x4019), iVar5 == 1)
       ) {
      peVar10 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_80);
      local_d8 = (ppStack_38->piece).m_val;
      torrent::add_suggest_piece(peVar10,(piece_index_t)local_d8);
    }
    if (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0) {
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
      if (bVar2) {
        uVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)ppStack_38);
        peer_log(this,outgoing_message,"PIECE","piece: %d s: %x l: %x",(ulong)uVar4,
                 (ulong)(uint)ppStack_38->start,ppStack_38->length);
        counters::blend_stats_counter(this->m_counters,0xf2,(long)(int)local_3c.m_val,5);
        iVar5 = session_settings::get_int
                          ((this->super_peer_connection_hot_members).m_settings,0x4019);
        if (iVar5 == 1) {
          peVar10 = ::std::
                    __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_80);
          local_e0 = (ppStack_38->piece).m_val;
          torrent::add_suggest_piece(peVar10,(piece_index_t)local_e0);
        }
        ppVar1 = ppStack_38;
        disk_buffer_holder::disk_buffer_holder(&local_f8,buffer);
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x28])(this,ppVar1,&local_f8);
        disk_buffer_holder::~disk_buffer_holder(&local_f8);
        local_94 = 0;
      }
      else {
        local_d9 = 0;
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,r_local,8,0);
        local_94 = 1;
      }
    }
    else {
      local_94 = 1;
    }
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_80);
  return;
}

Assistant:

void peer_connection::on_disk_read_complete(disk_buffer_holder buffer
		, storage_error const& error
		, peer_request const& r, time_point const issue_time)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(r.length >= 0);

		// return value:
		// 0: success, piece passed hash check
		// -1: disk failure

		int const disk_rtt = int(total_microseconds(clock_type::now() - issue_time));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "FILE_ASYNC_READ_COMPLETE"
				, "piece: %d s: %x l: %x b: %p e: %s rtt: %d us"
				, static_cast<int>(r.piece), r.start, r.length
				, static_cast<void*>(buffer.data())
				, error.ec.message().c_str(), disk_rtt);
		}
#endif

		m_reading_bytes -= r.length;

		auto t = m_torrent.lock();
		if (error)
		{
			if (!t)
			{
				disconnect(error.ec, operation_t::file_read);
				return;
			}

			write_dont_have(r.piece);
			write_reject_request(r);
			if (t->alerts().should_post<file_error_alert>())
				t->alerts().emplace_alert<file_error_alert>(error.ec
					, t->resolve_filename(error.file())
					, error.operation, t->get_handle());

			++m_disk_read_failures;
			if (m_disk_read_failures > 100) disconnect(error.ec, operation_t::file_read);
			return;
		}

		// we're only interested in failures in a row.
		// if we every now and then successfully send a
		// block, the peer is still useful
		m_disk_read_failures = 0;

		if (t && m_settings.get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache)
		{
			// tell the torrent that we just read a block from this piece.
			// if this piece is low-availability, it's now a candidate for being
			// suggested to other peers
			t->add_suggest_piece(r.piece);
		}

		if (m_disconnecting) return;

		if (!t)
		{
			disconnect(error.ec, operation_t::file_read);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message
			, "PIECE", "piece: %d s: %x l: %x"
			, static_cast<int>(r.piece), r.start, r.length);
#endif

		m_counters.blend_stats_counter(counters::request_latency, disk_rtt, 5);

		// we probably just pulled this piece into the cache.
		// if it's rare enough to make it into the suggested piece
		// push another piece out
		if (m_settings.get_int(settings_pack::suggest_mode) == settings_pack::suggest_read_cache)
		{
			t->add_suggest_piece(r.piece);
		}
		write_piece(r, std::move(buffer));
	}